

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O3

size_t ZSTD_compressContinue_internal
                 (ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,U32 frame,
                 U32 lastFrameChunk)

{
  ZSTD_matchState_t *ms;
  seqStore_t *origSeqStore;
  U32 *pUVar1;
  seqStore_t *resultSeqStore;
  seqStore_t *resultSeqStore_00;
  undefined8 uVar2;
  undefined8 uVar3;
  BYTE BVar4;
  ZSTD_paramSwitch_e ZVar5;
  ZSTD_strategy ZVar6;
  BYTE *pBVar7;
  BYTE *pBVar8;
  BYTE *pBVar9;
  ZSTD_compressedBlockState_t *pZVar10;
  seqDef *psVar11;
  U32 UVar12;
  ushort uVar13;
  short sVar14;
  uint uVar15;
  int iVar16;
  size_t err_code;
  size_t sVar17;
  ulong uVar18;
  size_t sVar19;
  byte bVar20;
  ushort uVar21;
  size_t sVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  ulong uVar26;
  ulong uVar27;
  size_t err_code_2;
  ulong dstCapacity_00;
  seqStore_t *psVar28;
  uint uVar29;
  seqStore_t *psVar30;
  BYTE *ip;
  int iVar31;
  BYTE *pBVar32;
  long lVar33;
  long lVar34;
  unsigned_long_long uVar35;
  bool bVar36;
  byte bVar37;
  undefined1 auVar38 [16];
  BYTE *op;
  BYTE *local_f0;
  repcodes_t dRep;
  undefined4 uStack_d4;
  ulong local_88;
  long local_68;
  repcodes_t local_60;
  size_t local_50;
  ZSTD_cwksp *local_48;
  BYTE *local_40;
  ulong local_38;
  
  bVar37 = 0;
  if (cctx->stage == ZSTDcs_created) {
    return 0xffffffffffffffc4;
  }
  if (cctx->stage == ZSTDcs_init && frame != 0) {
    local_50 = ZSTD_writeFrameHeader
                         (dst,dstCapacity,&cctx->appliedParams,cctx->pledgedSrcSizePlusOne - 1,
                          cctx->dictID);
    if (0xffffffffffffff88 < local_50) {
      return local_50;
    }
    bVar36 = dstCapacity < local_50;
    dstCapacity = dstCapacity - local_50;
    if (bVar36) {
      __assert_fail("fhSize <= dstCapacity",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                    ,0x11ed,
                    "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                   );
    }
    dst = (void *)((long)dst + local_50);
    cctx->stage = ZSTDcs_ongoing;
  }
  else {
    local_50 = 0;
  }
  if (srcSize == 0) {
    return local_50;
  }
  pBVar32 = (cctx->blockState).matchState.window.base;
  if (pBVar32 != (BYTE *)0x0) {
    pBVar7 = (cctx->blockState).matchState.window.dictBase;
    if (pBVar7 == (BYTE *)0x0) {
LAB_001b73db:
      __assert_fail("window->dictBase != NULL",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x4eb,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
    }
    ms = &(cctx->blockState).matchState;
    pBVar8 = (ms->window).nextSrc;
    bVar36 = (cctx->blockState).matchState.forceNonContiguous == 0;
    if (bVar36 && pBVar8 == (BYTE *)src) {
      uVar26 = (ulong)(cctx->blockState).matchState.window.dictLimit;
      pBVar32 = pBVar7;
      uVar29 = (cctx->blockState).matchState.window.lowLimit;
    }
    else {
      uVar26 = (long)pBVar8 - (long)pBVar32;
      uVar29 = (cctx->blockState).matchState.window.dictLimit;
      (cctx->blockState).matchState.window.lowLimit = uVar29;
      if (uVar26 >> 0x20 != 0) goto LAB_001b7419;
      uVar15 = (uint)uVar26;
      (cctx->blockState).matchState.window.dictLimit = uVar15;
      (cctx->blockState).matchState.window.dictBase = pBVar32;
      (cctx->blockState).matchState.window.base = (BYTE *)((long)src - uVar26);
      if (uVar15 - uVar29 < 8) {
        (cctx->blockState).matchState.window.lowLimit = uVar15;
        uVar29 = uVar15;
      }
    }
    pBVar7 = (BYTE *)((long)src + srcSize);
    (ms->window).nextSrc = pBVar7;
    if ((pBVar32 + uVar29 < pBVar7) && (src < pBVar32 + (uVar26 & 0xffffffff))) {
      UVar12 = (U32)((long)pBVar7 - (long)pBVar32);
      if ((long)(uVar26 & 0xffffffff) < (long)pBVar7 - (long)pBVar32) {
        UVar12 = (U32)uVar26;
      }
      (cctx->blockState).matchState.window.lowLimit = UVar12;
    }
    if (!bVar36 || pBVar8 != (BYTE *)src) {
      (cctx->blockState).matchState.forceNonContiguous = 0;
      (cctx->blockState).matchState.nextToUpdate = (U32)uVar26;
    }
    if ((cctx->appliedParams).ldmParams.enableLdm == ZSTD_ps_enable) {
      pBVar32 = (cctx->ldmState).window.base;
      if (pBVar32 == (BYTE *)0x0) goto LAB_001b73bc;
      pBVar8 = (cctx->ldmState).window.dictBase;
      if (pBVar8 == (BYTE *)0x0) goto LAB_001b73db;
      pBVar9 = (cctx->ldmState).window.nextSrc;
      if (pBVar9 == (BYTE *)src) {
        uVar26 = (ulong)(cctx->ldmState).window.dictLimit;
        pBVar32 = pBVar8;
        uVar29 = (cctx->ldmState).window.lowLimit;
      }
      else {
        uVar26 = (long)pBVar9 - (long)pBVar32;
        uVar29 = (cctx->ldmState).window.dictLimit;
        (cctx->ldmState).window.lowLimit = uVar29;
        if (uVar26 >> 0x20 != 0) {
LAB_001b7419:
          __assert_fail("distanceFromBase == (size_t)(U32)distanceFromBase",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x4f2,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)")
          ;
        }
        uVar15 = (uint)uVar26;
        (cctx->ldmState).window.dictLimit = uVar15;
        (cctx->ldmState).window.dictBase = pBVar32;
        (cctx->ldmState).window.base = (BYTE *)((long)src - uVar26);
        if (uVar15 - uVar29 < 8) {
          (cctx->ldmState).window.lowLimit = uVar15;
          uVar29 = uVar15;
        }
      }
      (cctx->ldmState).window.nextSrc = pBVar7;
      if ((pBVar32 + uVar29 < pBVar7) && (src < pBVar32 + (uVar26 & 0xffffffff))) {
        UVar12 = (U32)((long)pBVar7 - (long)pBVar32);
        if ((long)(uVar26 & 0xffffffff) < (long)pBVar7 - (long)pBVar32) {
          UVar12 = (U32)uVar26;
        }
        (cctx->ldmState).window.lowLimit = UVar12;
      }
    }
    if (frame == 0) {
      ZSTD_overflowCorrectIfNeeded(ms,&cctx->workspace,&cctx->appliedParams,src,pBVar7);
      uVar26 = ZSTD_compressBlock_internal(cctx,dst,dstCapacity,src,srcSize,0);
    }
    else {
      uVar29 = (cctx->appliedParams).cParams.windowLog;
      iVar31 = 1 << ((byte)uVar29 & 0x1f);
      if (0x1f < uVar29) {
        __assert_fail("cctx->appliedParams.cParams.windowLog <= ZSTD_WINDOWLOG_MAX",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x1133,
                      "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                     );
      }
      sVar22 = cctx->blockSize;
      if ((cctx->appliedParams).fParams.checksumFlag != 0) {
        ZSTD_XXH64_update(&cctx->xxhState,src,srcSize);
      }
      local_48 = &cctx->workspace;
      origSeqStore = &cctx->seqStore;
      pUVar1 = (cctx->blockSplitCtx).partitions;
      resultSeqStore = &(cctx->blockSplitCtx).nextSeqStore;
      resultSeqStore_00 = &(cctx->blockSplitCtx).currSeqStore;
      sVar17 = srcSize;
      op = (BYTE *)dst;
      do {
        uVar29 = lastFrameChunk & 1;
        if (sVar22 < sVar17) {
          uVar29 = 0;
        }
        if (dstCapacity < 6) {
          return 0xffffffffffffffba;
        }
        if (sVar17 < sVar22) {
          sVar22 = sVar17;
        }
        pBVar32 = (BYTE *)((long)src + sVar22);
        local_38 = sVar17;
        ZSTD_overflowCorrectIfNeeded(ms,local_48,&cctx->appliedParams,src,pBVar32);
        iVar16 = (int)(cctx->blockState).matchState.window.base;
        uVar23 = (int)pBVar32 - iVar16;
        uVar15 = (cctx->blockState).matchState.loadedDictEnd;
        local_40 = pBVar32;
        if (uVar23 < uVar15) {
          __assert_fail("blockEndIdx >= loadedDictEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                        ,0x4ba,
                        "void ZSTD_checkDictValidity(const ZSTD_window_t *, const void *, U32, U32 *, const ZSTD_matchState_t **)"
                       );
        }
        if ((uVar15 + iVar31 < uVar23) || (uVar15 != (cctx->blockState).matchState.window.dictLimit)
           ) {
          (cctx->blockState).matchState.loadedDictEnd = 0;
          (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
          uVar15 = 0;
        }
        uVar24 = (int)src - iVar16;
        uVar23 = (cctx->blockState).matchState.window.lowLimit;
        if (uVar15 + iVar31 < uVar24) {
          uVar24 = uVar24 - iVar31;
          if (uVar23 < uVar24) {
            (cctx->blockState).matchState.window.lowLimit = uVar24;
            uVar23 = uVar24;
          }
          if ((cctx->blockState).matchState.window.dictLimit < uVar23) {
            (cctx->blockState).matchState.window.dictLimit = uVar23;
          }
          (cctx->blockState).matchState.loadedDictEnd = 0;
          (cctx->blockState).matchState.dictMatchState = (ZSTD_matchState_t *)0x0;
        }
        if ((cctx->blockState).matchState.nextToUpdate < uVar23) {
          (cctx->blockState).matchState.nextToUpdate = uVar23;
        }
        uVar13 = (ushort)uVar29;
        sVar14 = (short)sVar22;
        if ((cctx->appliedParams).targetCBlockSize == 0) {
          ZVar5 = (cctx->appliedParams).useBlockSplitter;
          if (ZVar5 == ZSTD_ps_enable) {
            sVar17 = ZSTD_buildSeqStore(cctx,src,sVar22);
            if (0xffffffffffffff88 < sVar17) {
              return sVar17;
            }
            if (sVar17 == 1) {
              pZVar10 = (cctx->blockState).prevCBlock;
              if ((pZVar10->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
                (pZVar10->entropy).fse.offcode_repeatMode = FSE_repeat_check;
              }
              if (dstCapacity < sVar22 + 3) {
                return 0xffffffffffffffba;
              }
              *(ushort *)op = uVar13 + sVar14 * 8;
              op[2] = (BYTE)(sVar22 >> 0xd);
              memcpy(op + 3,src,sVar22);
              uVar18 = sVar22 + 3;
            }
            else {
              uVar26 = (ulong)((long)(cctx->seqStore).sequences -
                              (long)(cctx->seqStore).sequencesStart) >> 3;
              stack0xffffffffffffff28 = 0;
              uVar15 = (uint)uVar26;
              if (4 < uVar15) {
                dRep.rep._0_8_ = pUVar1;
                ZSTD_deriveBlockSplitsHelper
                          ((seqStoreSplits *)&dRep,0,uVar26 & 0xffffffff,cctx,origSeqStore);
                *(uint *)(dRep.rep._0_8_ + stack0xffffffffffffff28 * 4) = uVar15;
              }
              uVar26 = stack0xffffffffffffff28;
              pZVar10 = (cctx->blockState).prevCBlock;
              stack0xffffffffffffff28 = CONCAT44(uStack_d4,pZVar10->rep[2]);
              dRep.rep._0_8_ = *(undefined8 *)pZVar10->rep;
              local_60.rep._0_8_ = *(undefined8 *)pZVar10->rep;
              local_60.rep[2] = pZVar10->rep[2];
              (cctx->blockSplitCtx).nextSeqStore.maxNbLit = 0;
              (cctx->blockSplitCtx).nextSeqStore.longLengthType = ZSTD_llt_none;
              (cctx->blockSplitCtx).nextSeqStore.longLengthPos = 0;
              (cctx->blockSplitCtx).nextSeqStore.ofCode = (BYTE *)0x0;
              (cctx->blockSplitCtx).nextSeqStore.maxNbSeq = 0;
              (cctx->blockSplitCtx).nextSeqStore.llCode = (BYTE *)0x0;
              (cctx->blockSplitCtx).nextSeqStore.mlCode = (BYTE *)0x0;
              (cctx->blockSplitCtx).nextSeqStore.litStart = (BYTE *)0x0;
              (cctx->blockSplitCtx).nextSeqStore.lit = (BYTE *)0x0;
              resultSeqStore->sequencesStart = (seqDef *)0x0;
              resultSeqStore->sequences = (seqDef *)0x0;
              if (uVar26 == 0) {
                uVar18 = ZSTD_compressSeqStore_singleBlock
                                   (cctx,origSeqStore,&dRep,&local_60,op,dstCapacity,src,sVar22,
                                    uVar29,0);
                if (uVar18 < 0xffffffffffffff89) {
                  if (0x20000 < cctx->blockSize) {
                    __assert_fail("zc->blockSize <= ZSTD_BLOCKSIZE_MAX",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                  ,0x1034,
                                  "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                 );
                  }
                  if (cctx->blockSize + 3 < uVar18) {
                    __assert_fail("cSizeSingleBlock <= zc->blockSize + ZSTD_blockHeaderSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                  ,0x1035,
                                  "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                 );
                  }
                }
              }
              else {
                ZSTD_deriveSeqStoreChunk(resultSeqStore_00,origSeqStore,0,(ulong)*pUVar1);
                local_88 = 0;
                uVar27 = 0;
                local_68 = 0;
                dstCapacity_00 = dstCapacity;
                pBVar32 = op;
                local_f0 = (BYTE *)src;
                do {
                  sVar17 = ZSTD_countSeqStoreLiteralsBytes(resultSeqStore_00);
                  psVar11 = (cctx->blockSplitCtx).currSeqStore.sequencesStart;
                  lVar25 = (long)(cctx->blockSplitCtx).currSeqStore.sequences - (long)psVar11;
                  if (lVar25 == 0) {
                    lVar34 = 0;
                  }
                  else {
                    lVar25 = lVar25 >> 3;
                    lVar34 = 0;
                    uVar18 = 0;
                    do {
                      lVar33 = lVar34 + (ulong)psVar11[uVar18].mlBase;
                      lVar34 = lVar33 + 3;
                      if (((cctx->blockSplitCtx).currSeqStore.longLengthPos == uVar18) &&
                         ((cctx->blockSplitCtx).currSeqStore.longLengthType == ZSTD_llt_matchLength)
                         ) {
                        lVar34 = lVar33 + 0x10003;
                      }
                      uVar18 = uVar18 + 1;
                    } while (lVar25 + (ulong)(lVar25 == 0) != uVar18);
                  }
                  sVar17 = lVar34 + sVar17;
                  local_68 = local_68 + sVar17;
                  if (uVar27 == uVar26) {
                    sVar17 = (sVar17 + sVar22) - local_68;
                    uVar15 = uVar29;
                  }
                  else {
                    ZSTD_deriveSeqStoreChunk
                              (resultSeqStore,origSeqStore,(ulong)pUVar1[uVar27],
                               (ulong)(cctx->blockSplitCtx).partitions[uVar27 + 1]);
                    uVar15 = 0;
                  }
                  uVar18 = ZSTD_compressSeqStore_singleBlock
                                     (cctx,resultSeqStore_00,&dRep,&local_60,pBVar32,dstCapacity_00,
                                      local_f0,sVar17,uVar15,1);
                  if (0xffffffffffffff88 < uVar18) goto LAB_001b722a;
                  psVar28 = resultSeqStore;
                  psVar30 = resultSeqStore_00;
                  for (lVar25 = 10; lVar25 != 0; lVar25 = lVar25 + -1) {
                    psVar30->sequencesStart = psVar28->sequencesStart;
                    psVar28 = (seqStore_t *)((long)psVar28 + (ulong)bVar37 * -0x10 + 8);
                    psVar30 = (seqStore_t *)((long)psVar30 + (ulong)bVar37 * -0x10 + 8);
                  }
                  if (cctx->blockSize + 3 < uVar18) {
                    __assert_fail("cSizeChunk <= zc->blockSize + ZSTD_blockHeaderSize",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                                  ,0x1057,
                                  "size_t ZSTD_compressBlock_splitBlock_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                                 );
                  }
                  local_88 = local_88 + uVar18;
                  dstCapacity_00 = dstCapacity_00 - uVar18;
                  pBVar32 = pBVar32 + uVar18;
                  local_f0 = local_f0 + sVar17;
                  uVar27 = uVar27 + 1;
                } while (uVar27 <= uVar26);
                pZVar10 = (cctx->blockState).prevCBlock;
                pZVar10->rep[2] = dRep.rep[2];
                *(undefined8 *)pZVar10->rep = dRep.rep._0_8_;
                uVar18 = local_88;
              }
            }
LAB_001b722a:
            if (0xffffffffffffff88 < uVar18) {
              return uVar18;
            }
            if (uVar18 == 0) {
              if ((cctx->seqCollector).collectSequences != 1) {
                __assert_fail("cSize > 0 || cctx->seqCollector.collectSequences == 1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                              ,0x1155,
                              "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                             );
              }
              uVar18 = 0;
            }
          }
          else {
            if (ZVar5 == ZSTD_ps_auto) {
              __assert_fail("cctxParams->useBlockSplitter != ZSTD_ps_auto",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                            ,0xa7a,"int ZSTD_blockSplitterEnabled(ZSTD_CCtx_params *)");
            }
            sVar17 = ZSTD_compressBlock_internal(cctx,op + 3,dstCapacity - 3,src,sVar22,1);
            if (0xffffffffffffff88 < sVar17) {
              return sVar17;
            }
            if (sVar17 == 1) {
              uVar21 = 2;
              sVar19 = sVar22;
            }
            else {
              if (sVar17 == 0) {
                uVar18 = sVar22 + 3;
                if (dstCapacity < uVar18) {
                  return 0xffffffffffffffba;
                }
                *(ushort *)op = uVar13 + sVar14 * 8;
                op[2] = (BYTE)(sVar22 >> 0xd);
                memcpy(op + 3,src,sVar22);
                if (0xffffffffffffff88 < uVar18) {
                  return uVar18;
                }
                goto LAB_001b6ca1;
              }
              uVar21 = 4;
              sVar19 = sVar17;
            }
            *(ushort *)op = (uVar21 | uVar13) + (short)sVar19 * 8;
            op[2] = (BYTE)(sVar19 >> 0xd);
            uVar18 = sVar17 + 3;
          }
        }
        else {
          sVar17 = ZSTD_buildSeqStore(cctx,src,sVar22);
          if (0xffffffffffffff88 < sVar17) {
            return sVar17;
          }
          if (sVar17 == 0) {
            if ((((cctx->isFirstBlock != 0) ||
                 (0x1f < (ulong)((long)(cctx->seqStore).sequences -
                                (long)(cctx->seqStore).sequencesStart))) ||
                (9 < (ulong)((long)(cctx->seqStore).lit - (long)(cctx->seqStore).litStart))) ||
               (iVar16 = ZSTD_isRLE((BYTE *)src,sVar22), iVar16 == 0)) {
              uVar18 = ZSTD_compressSuperBlock(cctx,op,dstCapacity,src,sVar22,uVar29);
              if (uVar18 != 0xffffffffffffffba) {
                ZVar6 = (cctx->appliedParams).cParams.strategy;
                if (ZVar6 + ~ZSTD_btultra2 < 0xfffffff7) {
                  __assert_fail("ZSTD_cParam_withinBounds(ZSTD_c_strategy, (int)strat)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                                ,600,"size_t ZSTD_minGain(size_t, ZSTD_strategy)");
                }
                if (0xffffffffffffff88 < uVar18) {
                  return uVar18;
                }
                bVar20 = (char)ZVar6 - 1;
                if (ZVar6 < ZSTD_btultra) {
                  bVar20 = 6;
                }
                if ((uVar18 != 0) && (uVar18 < (sVar22 - (sVar22 >> (bVar20 & 0x3f))) + 1)) {
                  uVar2 = (cctx->blockState).prevCBlock;
                  uVar3 = (cctx->blockState).nextCBlock;
                  auVar38._8_4_ = (int)uVar2;
                  auVar38._0_8_ = uVar3;
                  auVar38._12_4_ = (int)((ulong)uVar2 >> 0x20);
                  (cctx->blockState).prevCBlock = (ZSTD_compressedBlockState_t *)uVar3;
                  (cctx->blockState).nextCBlock = (ZSTD_compressedBlockState_t *)auVar38._8_8_;
                  goto LAB_001b6c6c;
                }
              }
              goto LAB_001b6c1d;
            }
            BVar4 = *src;
            *(ushort *)op = uVar13 + sVar14 * 8 + 2;
            op[2] = (BYTE)(sVar22 >> 0xd);
            op[3] = BVar4;
            uVar18 = 4;
          }
          else {
LAB_001b6c1d:
            uVar18 = sVar22 + 3;
            if (dstCapacity < uVar18) {
              return 0xffffffffffffffba;
            }
            *(ushort *)op = uVar13 + sVar14 * 8;
            op[2] = (BYTE)(sVar22 >> 0xd);
            memcpy(op + 3,src,sVar22);
            if (0xffffffffffffff88 < uVar18) {
              return uVar18;
            }
          }
LAB_001b6c6c:
          pZVar10 = (cctx->blockState).prevCBlock;
          if ((pZVar10->entropy).fse.offcode_repeatMode == FSE_repeat_valid) {
            (pZVar10->entropy).fse.offcode_repeatMode = FSE_repeat_check;
          }
          if (uVar18 == 0) {
            __assert_fail("cSize > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1150,
                          "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                         );
          }
          if (sVar22 + 3 < uVar18) {
            __assert_fail("cSize <= blockSize + ZSTD_blockHeaderSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                          ,0x1151,
                          "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                         );
          }
        }
LAB_001b6ca1:
        bVar36 = dstCapacity < uVar18;
        dstCapacity = dstCapacity - uVar18;
        if (bVar36) {
          __assert_fail("dstCapacity >= cSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x116d,
                        "size_t ZSTD_compress_frameChunk(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32)"
                       );
        }
        op = op + uVar18;
        cctx->isFirstBlock = 0;
        sVar17 = local_38 - sVar22;
        src = local_40;
      } while (sVar17 != 0);
      if ((lastFrameChunk != 0) && (dst < op)) {
        cctx->stage = ZSTDcs_ending;
      }
      uVar26 = (long)op - (long)dst;
    }
    if (uVar26 < 0xffffffffffffff89) {
      uVar35 = srcSize + cctx->consumedSrcSize;
      cctx->consumedSrcSize = uVar35;
      uVar26 = uVar26 + local_50;
      cctx->producedCSize = cctx->producedCSize + uVar26;
      uVar18 = cctx->pledgedSrcSizePlusOne;
      if (uVar18 == 0 && (cctx->appliedParams).fParams.contentSizeFlag != 0) {
        __assert_fail("!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                      ,0x120b,
                      "size_t ZSTD_compressContinue_internal(ZSTD_CCtx *, void *, size_t, const void *, size_t, U32, U32)"
                     );
      }
      sVar22 = 0xffffffffffffffb8;
      if (uVar35 + 1 <= uVar18) {
        sVar22 = uVar26;
      }
      if (uVar18 != 0) {
        uVar26 = sVar22;
      }
    }
    return uVar26;
  }
LAB_001b73bc:
  __assert_fail("window->base != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                ,0x4ea,"U32 ZSTD_window_update(ZSTD_window_t *, const void *, size_t, int)");
}

Assistant:

static size_t ZSTD_compressContinue_internal (ZSTD_CCtx* cctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize,
                               U32 frame, U32 lastFrameChunk)
{
    ZSTD_matchState_t* const ms = &cctx->blockState.matchState;
    size_t fhSize = 0;

    DEBUGLOG(5, "ZSTD_compressContinue_internal, stage: %u, srcSize: %u",
                cctx->stage, (unsigned)srcSize);
    RETURN_ERROR_IF(cctx->stage==ZSTDcs_created, stage_wrong,
                    "missing init (ZSTD_compressBegin)");

    if (frame && (cctx->stage==ZSTDcs_init)) {
        fhSize = ZSTD_writeFrameHeader(dst, dstCapacity, &cctx->appliedParams,
                                       cctx->pledgedSrcSizePlusOne-1, cctx->dictID);
        FORWARD_IF_ERROR(fhSize, "ZSTD_writeFrameHeader failed");
        assert(fhSize <= dstCapacity);
        dstCapacity -= fhSize;
        dst = (char*)dst + fhSize;
        cctx->stage = ZSTDcs_ongoing;
    }

    if (!srcSize) return fhSize;  /* do not generate an empty block if no input */

    if (!ZSTD_window_update(&ms->window, src, srcSize, ms->forceNonContiguous)) {
        ms->forceNonContiguous = 0;
        ms->nextToUpdate = ms->window.dictLimit;
    }
    if (cctx->appliedParams.ldmParams.enableLdm == ZSTD_ps_enable) {
        ZSTD_window_update(&cctx->ldmState.window, src, srcSize, /* forceNonContiguous */ 0);
    }

    if (!frame) {
        /* overflow check and correction for block mode */
        ZSTD_overflowCorrectIfNeeded(
            ms, &cctx->workspace, &cctx->appliedParams,
            src, (BYTE const*)src + srcSize);
    }

    DEBUGLOG(5, "ZSTD_compressContinue_internal (blockSize=%u)", (unsigned)cctx->blockSize);
    {   size_t const cSize = frame ?
                             ZSTD_compress_frameChunk (cctx, dst, dstCapacity, src, srcSize, lastFrameChunk) :
                             ZSTD_compressBlock_internal (cctx, dst, dstCapacity, src, srcSize, 0 /* frame */);
        FORWARD_IF_ERROR(cSize, "%s", frame ? "ZSTD_compress_frameChunk failed" : "ZSTD_compressBlock_internal failed");
        cctx->consumedSrcSize += srcSize;
        cctx->producedCSize += (cSize + fhSize);
        assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
        if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
            ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
            RETURN_ERROR_IF(
                cctx->consumedSrcSize+1 > cctx->pledgedSrcSizePlusOne,
                srcSize_wrong,
                "error : pledgedSrcSize = %u, while realSrcSize >= %u",
                (unsigned)cctx->pledgedSrcSizePlusOne-1,
                (unsigned)cctx->consumedSrcSize);
        }
        return cSize + fhSize;
    }
}